

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall
BuildWithQueryDepsLogTestTwoOutputsDepFileGCCMultiLineInput::
BuildWithQueryDepsLogTestTwoOutputsDepFileGCCMultiLineInput
          (BuildWithQueryDepsLogTestTwoOutputsDepFileGCCMultiLineInput *this)

{
  BuildWithQueryDepsLogTestTwoOutputsDepFileGCCMultiLineInput *this_local;
  
  BuildWithQueryDepsLogTest::BuildWithQueryDepsLogTest(&this->super_BuildWithQueryDepsLogTest);
  (this->super_BuildWithQueryDepsLogTest).super_BuildTest.super_StateTestWithBuiltinRules.super_Test
  ._vptr_Test = (_func_int **)
                &PTR__BuildWithQueryDepsLogTestTwoOutputsDepFileGCCMultiLineInput_002a1ef8;
  (this->super_BuildWithQueryDepsLogTest).super_BuildTest.super_BuildLogUser._vptr_BuildLogUser =
       (_func_int **)&DAT_002a1f38;
  return;
}

Assistant:

TEST_F(BuildWithQueryDepsLogTest, TwoOutputsDepFileGCCMultiLineInput) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule cp_multi_gcc\n"
"    command = echo '$out: in1\\n$out: in2' > in.d && for file in $out; do cp in1 $$file; done\n"
"    deps = gcc\n"
"    depfile = in.d\n"
"build out1 out2: cp_multi_gcc in1 in2\n"));

  std::string err;
  EXPECT_TRUE(builder_.AddTarget("out1", &err));
  ASSERT_EQ("", err);
  fs_.Create("in.d", "out1 out2: in1\nout1 out2: in2");
  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ("", err);
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());
  EXPECT_EQ("echo 'out1 out2: in1\\nout1 out2: in2' > in.d && for file in out1 out2; do cp in1 $file; done", command_runner_.commands_ran_[0]);

  Node* out1_node = state_.LookupNode("out1");
  DepsLog::Deps* out1_deps = log_.GetDeps(out1_node);
  EXPECT_EQ(2, out1_deps->node_count);
  EXPECT_EQ("in1", out1_deps->nodes[0]->path());
  EXPECT_EQ("in2", out1_deps->nodes[1]->path());

  Node* out2_node = state_.LookupNode("out2");
  DepsLog::Deps* out2_deps = log_.GetDeps(out2_node);
  EXPECT_EQ(2, out2_deps->node_count);
  EXPECT_EQ("in1", out2_deps->nodes[0]->path());
  EXPECT_EQ("in2", out2_deps->nodes[1]->path());
}